

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O1

pboolean p_dir_rewind(PDir *dir,PError **error)

{
  pboolean pVar1;
  
  if ((dir == (PDir *)0x0) || ((DIR *)dir->dir == (DIR *)0x0)) {
    p_dir_rewind_cold_1();
    pVar1 = 0;
  }
  else {
    rewinddir((DIR *)dir->dir);
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

P_LIB_API pboolean
p_dir_rewind (PDir	*dir,
	      PError	**error)
{
	if (P_UNLIKELY (dir == NULL || dir->dir == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	rewinddir (dir->dir);

	return TRUE;
}